

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O3

int callback_cancel(uint id)

{
  callback_t *pcVar1;
  callback_t *pcVar2;
  callback_t **ppcVar3;
  callback_t *__ptr;
  
  ppcVar3 = &gCallBackFirst;
  __ptr = gCallBackFirst;
  while( true ) {
    if (__ptr == (callback_t *)0x0) {
      return -0x7da;
    }
    if (__ptr->id == id) break;
    __ptr = __ptr->next;
  }
  pcVar1 = __ptr->prev;
  pcVar2 = __ptr->next;
  if (pcVar1 != (callback_t *)0x0) {
    ppcVar3 = &pcVar1->next;
  }
  *ppcVar3 = pcVar2;
  if (pcVar2 == (callback_t *)0x0) {
    ppcVar3 = &gCallBackLast;
  }
  else {
    ppcVar3 = &pcVar2->prev;
  }
  *ppcVar3 = pcVar1;
  free(__ptr);
  findNotifyBits();
  return 0;
}

Assistant:

int callback_cancel(unsigned id)
{
   callback_t *p;

   p = gCallBackFirst;

   while (p)
   {
      if (p->id == id)
      {
         if (p->prev) p->prev->next = p->next;
         else gCallBackFirst = p->next;

         if (p->next) p->next->prev = p->prev;
         else gCallBackLast = p->prev;

         free(p);

         findNotifyBits();

         return 0;
      }
      p = p->next;
   }
   return pigif_callback_not_found;
}